

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool rm(upb_table *t,lookupkey_t key,upb_value *val,upb_tabkey *removed,uint32_t hash,
        eqlfunc_t *eql)

{
  upb_tabkey uVar1;
  _upb_tabent *p_Var2;
  uint64_t uVar3;
  _Bool _Var4;
  upb_tabent *move;
  upb_tabent *puVar5;
  _upb_tabent **pp_Var6;
  uint uVar7;
  
  uVar7 = hash & t->mask;
  uVar1 = t->entries[uVar7].key;
  if (uVar1 == 0) {
LAB_00129f17:
    _Var4 = false;
  }
  else {
    puVar5 = t->entries + uVar7;
    _Var4 = (*eql)(uVar1,key);
    if (_Var4) {
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        val->val = (puVar5->val).val;
      }
      if (removed != (upb_tabkey *)0x0) {
        *removed = puVar5->key;
      }
      p_Var2 = puVar5->next;
      if (p_Var2 == (_upb_tabent *)0x0) {
        puVar5->key = 0;
      }
      else {
        puVar5->next = p_Var2->next;
        uVar3 = (p_Var2->val).val;
        puVar5->key = p_Var2->key;
        (puVar5->val).val = uVar3;
        p_Var2->key = 0;
      }
    }
    else {
      while( true ) {
        pp_Var6 = &puVar5->next;
        if (puVar5->next == (_upb_tabent *)0x0) break;
        _Var4 = (*eql)(puVar5->next->key,key);
        if (_Var4) break;
        puVar5 = *pp_Var6;
      }
      p_Var2 = *pp_Var6;
      if (p_Var2 == (_upb_tabent *)0x0) goto LAB_00129f17;
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        val->val = (p_Var2->val).val;
      }
      if (removed != (upb_tabkey *)0x0) {
        *removed = p_Var2->key;
      }
      p_Var2->key = 0;
      *pp_Var6 = p_Var2->next;
    }
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

static bool rm(upb_table* t, lookupkey_t key, upb_value* val,
               upb_tabkey* removed, uint32_t hash, eqlfunc_t* eql) {
  upb_tabent* chain = getentry_mutable(t, hash);
  if (upb_tabent_isempty(chain)) return false;
  if (eql(chain->key, key)) {
    /* Element to remove is at the head of its chain. */
    t->count--;
    if (val) _upb_value_setval(val, chain->val.val);
    if (removed) *removed = chain->key;
    if (chain->next) {
      upb_tabent* move = (upb_tabent*)chain->next;
      *chain = *move;
      move->key = 0; /* Make the slot empty. */
    } else {
      chain->key = 0; /* Make the slot empty. */
    }
    return true;
  } else {
    /* Element to remove is either in a non-head position or not in the
     * table. */
    while (chain->next && !eql(chain->next->key, key)) {
      chain = (upb_tabent*)chain->next;
    }
    if (chain->next) {
      /* Found element to remove. */
      upb_tabent* rm = (upb_tabent*)chain->next;
      t->count--;
      if (val) _upb_value_setval(val, chain->next->val.val);
      if (removed) *removed = rm->key;
      rm->key = 0; /* Make the slot empty. */
      chain->next = rm->next;
      return true;
    } else {
      /* Element to remove is not in the table. */
      return false;
    }
  }
}